

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstyleditemdelegate.cpp
# Opt level: O2

QWidget * __thiscall
QStyledItemDelegate::createEditor
          (QStyledItemDelegate *this,QWidget *parent,QStyleOptionViewItem *option,QModelIndex *index
          )

{
  QStyledItemDelegatePrivate *this_00;
  bool bVar1;
  uint uVar2;
  int iVar3;
  QItemEditorFactory *pQVar4;
  undefined4 extraout_var;
  long in_FS_OFFSET;
  QVariant QStack_48;
  long local_28;
  QWidget *pQVar5;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = *(QStyledItemDelegatePrivate **)(this + 8);
  bVar1 = QModelIndex::isValid(index);
  if (bVar1) {
    pQVar4 = QStyledItemDelegatePrivate::editorFactory(this_00);
    QModelIndex::data(&QStack_48,index,2);
    uVar2 = ::QVariant::typeId(&QStack_48);
    iVar3 = (*pQVar4->_vptr_QItemEditorFactory[2])(pQVar4,(ulong)uVar2,parent);
    pQVar5 = (QWidget *)CONCAT44(extraout_var,iVar3);
    ::QVariant::~QVariant(&QStack_48);
  }
  else {
    pQVar5 = (QWidget *)0x0;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return pQVar5;
  }
  __stack_chk_fail();
}

Assistant:

QWidget *QStyledItemDelegate::createEditor(QWidget *parent,
                                     const QStyleOptionViewItem &option,
                                     const QModelIndex &index) const
{
    Q_UNUSED(option);
    Q_D(const QStyledItemDelegate);
    if (!index.isValid())
        return nullptr;
    return d->editorFactory()->createEditor(index.data(Qt::EditRole).userType(), parent);
}